

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_boundaries_state.cpp
# Opt level: O2

void __thiscall
duckdb::WindowBoundariesState::WindowBoundariesState
          (WindowBoundariesState *this,BoundWindowExpression *wexpr,idx_t input_size)

{
  pointer pBVar1;
  pointer pBVar2;
  OrderType OVar3;
  const_reference pvVar4;
  WindowBoundary WVar5;
  
  GetWindowBounds(&this->required,wexpr);
  this->type = (wexpr->super_Expression).super_BaseExpression.type;
  this->input_size = input_size;
  WVar5 = wexpr->start;
  this->start_boundary = WVar5;
  this->end_boundary = wexpr->end;
  this->partition_count =
       (long)(wexpr->partitions).
             super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)(wexpr->partitions).
             super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_start >> 3;
  pBVar1 = (wexpr->orders).
           super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
           super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pBVar2 = (wexpr->orders).
           super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
           super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
  this->order_count = ((long)pBVar1 - (long)pBVar2) / 0x18;
  if (pBVar1 == pBVar2) {
    OVar3 = INVALID;
  }
  else {
    pvVar4 = vector<duckdb::BoundOrderByNode,_true>::get<true>(&wexpr->orders,0);
    OVar3 = pvVar4->type;
    WVar5 = wexpr->start;
  }
  this->range_sense = OVar3;
  this->has_preceding_range = wexpr->end == EXPR_PRECEDING_RANGE || WVar5 == EXPR_PRECEDING_RANGE;
  this->has_following_range = wexpr->end == EXPR_FOLLOWING_RANGE || WVar5 == EXPR_FOLLOWING_RANGE;
  this->next_pos = 0;
  this->partition_start = 0;
  this->partition_end = 0;
  this->peer_start = 0;
  this->valid_start = 0;
  this->valid_end = 0;
  (this->prev).start = 0;
  (this->prev).end = 0;
  (this->range_lo).ptr = (WindowCursor *)0x0;
  (this->range_hi).
  super_unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>._M_t.
  super___uniq_ptr_impl<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::WindowCursor_*,_std::default_delete<duckdb::WindowCursor>_>.
  super__Head_base<0UL,_duckdb::WindowCursor_*,_false>._M_head_impl = (WindowCursor *)0x0;
  return;
}

Assistant:

WindowBoundariesState::WindowBoundariesState(const BoundWindowExpression &wexpr, const idx_t input_size)
    : required(GetWindowBounds(wexpr)), type(wexpr.GetExpressionType()), input_size(input_size),
      start_boundary(wexpr.start), end_boundary(wexpr.end), partition_count(wexpr.partitions.size()),
      order_count(wexpr.orders.size()), range_sense(wexpr.orders.empty() ? OrderType::INVALID : wexpr.orders[0].type),
      has_preceding_range(HasPrecedingRange(wexpr)), has_following_range(HasFollowingRange(wexpr)) {
}